

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O1

bool benchmark::ParseDouble(string *src_text,char *str,double *value)

{
  char cVar1;
  ostream *poVar2;
  size_t sVar3;
  double dVar4;
  char *end;
  char *local_30;
  
  local_30 = (char *)0x0;
  dVar4 = strtod(str,&local_30);
  cVar1 = *local_30;
  if (cVar1 == '\0') {
    *value = dVar4;
  }
  else {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(src_text->_M_dataplus)._M_p,
                        src_text->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is expected to be a double, ",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"but actually has value \"",0x18);
    if (str == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,str,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".\n",3);
  }
  return cVar1 == '\0';
}

Assistant:

bool ParseDouble(const std::string& src_text, const char* str, double* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const double double_value = strtod(str, &end);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    std::cerr << src_text << " is expected to be a double, "
              << "but actually has value \"" << str << "\".\n";
    return false;
  }

  *value = double_value;
  return true;
}